

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v10::detail::write_loc
               (appender out,loc_value value,format_specs<char> *specs,locale_ref loc)

{
  loc_value val;
  bool bVar1;
  format_facet<std::locale> *this;
  format_facet<std::locale> local_e0;
  undefined4 local_6c;
  longlong local_68;
  size_t sStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_48;
  locale_ref local_30;
  locale locale;
  format_specs<char> *specs_local;
  locale_ref loc_local;
  appender out_local;
  
  val.value_ = value.value_;
  _locale = specs;
  locale_ref::get<std::locale>(&local_30);
  bVar1 = std::has_facet<fmt::v10::format_facet<std::locale>>((locale *)&local_30);
  if (bVar1) {
    this = std::use_facet<fmt::v10::format_facet<std::locale>>((locale *)&local_30);
    local_68 = value.value_.value_.field_0.long_long_value;
    sStack_60 = value.value_.value_.field_0.string.size;
    local_58._0_4_ = value.value_.type_;
    local_58._4_4_ = value.value_._20_4_;
    value.value_._24_8_ = val.value_._24_8_;
    uStack_50 = value.value_._24_8_;
    local_48 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._7_1_ =
         format_facet<std::locale>::put(this,out,val,_locale);
  }
  else {
    format_facet<std::locale>::format_facet(&local_e0,(locale *)&local_30);
    out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._7_1_ =
         format_facet<std::locale>::put(&local_e0,out,value,_locale);
    format_facet<std::locale>::~format_facet(&local_e0);
  }
  local_6c = 1;
  std::locale::~locale((locale *)&local_30);
  return out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._7_1_;
}

Assistant:

FMT_FUNC auto write_loc(appender out, loc_value value,
                        const format_specs<>& specs, locale_ref loc) -> bool {
#ifndef FMT_STATIC_THOUSANDS_SEPARATOR
  auto locale = loc.get<std::locale>();
  // We cannot use the num_put<char> facet because it may produce output in
  // a wrong encoding.
  using facet = format_facet<std::locale>;
  if (std::has_facet<facet>(locale))
    return std::use_facet<facet>(locale).put(out, value, specs);
  return facet(locale).put(out, value, specs);
#endif
  return false;
}